

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O3

void __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
::InitOwnOptions(FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                 *this)

{
  _Base_ptr *pp_Var1;
  Env *pEVar2;
  size_type *psVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *plVar5;
  size_type *psVar6;
  long *plVar7;
  initializer_list<mp::SolveResultRegistry::RegEntry> __l;
  ValueArrayRef values;
  ValueArrayRef values_00;
  string __str;
  allocator_type local_c1;
  RegEntry local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long *local_78 [2];
  long local_68 [2];
  _Rb_tree<mp::SolveResultRegistry::RegEntry,_mp::SolveResultRegistry::RegEntry,_std::_Identity<mp::SolveResultRegistry::RegEntry>,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
  local_58;
  
  ConstraintManager::ConsiderAcceptanceOptions
            (&(this->super_FlatModel<mp::DefaultFlatModelParams>).super_ConstraintManager,
             (BasicFlatConverter *)this,&(this->modelapi_).super_BasicFlatModelAPI,
             (this->super_EnvKeeper).env_);
  SolverOptionManager::AddStoredOption<std::__cxx11::string>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "tech:writegraph cvt:writegraph writegraph exportgraph",
             "File to export conversion graph. Format: JSON Lines.",
             &(this->options_).file_graph_export_,(ValueArrayRef)ZEXT816(0));
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:pre:all",
             "0/1*: Set to 0 to disable most presolve in the flat converter.",
             &(this->options_).preprocessAnything_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:pre:eqresult",
             "0/1*: Preprocess reified equality comparison\'s decidable cases.",
             &(this->options_).preprocessEqualityResultBounds_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:pre:eqbinary",
             "0/1*: Preprocess reified equality comparison with a binary variable.",
             &(this->options_).preprocessEqualityBvar_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:pre:ineqresult",
             "0/1*: Preprocess reified inequality comparison\'s decidable cases.",
             &(this->options_).preprocessInequalityResultBounds_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:pre:ineqrhs",
             "0/1*: Preprocess reified inequality comparison\'s right-hand sides.",
             &(this->options_).preprocessInequalityRhs_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:pre:unnest",
             "0/1*: Inline nested expressions, currently Ands/Ors.",
             &(this->options_).preproNestedAndOrs_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:quadobj passquadobj",
             "0*/1: Pass quadratic objective terms to the solver. When 0, if the solver accepts quadratic constraints, such a constraint will be created with those, otherwise linearly approximated."
             ,&(this->options_).passQuadObj_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:quadcon passquadcon",
             "Convenience option. Set to 0 to disable quadratic constraints. Synonym for acc:quad..=0. Currently this disables out-multiplication of quadratic terms, then they are linearized."
             ,&(this->options_).passQuadCon_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "cvt:qp2passes cvt:qp2pass qp2passes qp2pass",
             "Parse sums of QP expressions in 2 passes. Usually faster. Default 1.",
             &(this->options_).useQP2Pass_,0,1);
  SolverOptionManager::AddStoredOption<double>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "cvt:multoutcard multoutcard",
             "Up to which (estimated) QP matrix cardinality should a product of 2 linear expressions be multiplied out. Default 1e9.\n\nCan speed up model input, but prone to numerical issues."
             ,&(this->options_).QPMultOutCard_,0.0,1e+20);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:expcones expcones",
             "0*/1: Recognize exponential cones.",&(this->options_).passExpCones_,0,1);
  (this->options_).passExpCones_ = 0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct((ulong)local_78,'\x01');
  *(undefined1 *)local_78[0] = 0x30;
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x4a08b6);
  psVar3 = (size_type *)((long)&local_c0 + 0x10);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    local_c0.descr_._M_string_length = *psVar6;
    local_c0.descr_.field_2._M_allocated_capacity = plVar5[3];
    local_c0._0_8_ = psVar3;
  }
  else {
    local_c0.descr_._M_string_length = *psVar6;
    local_c0._0_8_ = (size_type *)*plVar5;
  }
  local_c0.descr_._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  pp_Var1 = &local_58._M_impl.super__Rb_tree_header._M_header._M_parent;
  plVar7 = plVar5 + 2;
  if ((_Base_ptr *)*plVar5 == (_Base_ptr *)plVar7) {
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar7;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar5[3];
    local_58._M_impl._0_8_ = pp_Var1;
  }
  else {
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar7;
    local_58._M_impl._0_8_ = (_Base_ptr *)*plVar5;
  }
  local_58._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->socp_mode_text_,(string *)&local_58);
  if ((_Base_ptr *)local_58._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_58._M_impl._0_8_,
                    (ulong)((long)&(local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((size_type *)local_c0._0_8_ != psVar3) {
    operator_delete((void *)local_c0._0_8_,local_c0.descr_._M_string_length + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  values._8_8_ = 3;
  values.values_ = this->socp_values_;
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"cvt:socp socpmode socp",
             (this->socp_mode_text_)._M_dataplus._M_p,&(this->options_).passSOCPCones_,values);
  (this->options_).passSOCPCones_ = 0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct((ulong)local_78,'\x01');
  *(undefined1 *)local_78[0] = 0x32;
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0x4a097b);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    local_c0.descr_._M_string_length = *psVar6;
    local_c0.descr_.field_2._M_allocated_capacity = plVar5[3];
    local_c0._0_8_ = psVar3;
  }
  else {
    local_c0.descr_._M_string_length = *psVar6;
    local_c0._0_8_ = (size_type *)*plVar5;
  }
  local_c0.descr_._M_dataplus._M_p = (pointer)plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
  plVar7 = plVar5 + 2;
  if ((_Base_ptr *)*plVar5 == (_Base_ptr *)plVar7) {
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar7;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar5[3];
    local_58._M_impl._0_8_ = pp_Var1;
  }
  else {
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar7;
    local_58._M_impl._0_8_ = (_Base_ptr *)*plVar5;
  }
  local_58._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->socp2qc_mode_text_,(string *)&local_58);
  if ((_Base_ptr *)local_58._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_58._M_impl._0_8_,
                    (ulong)((long)&(local_58._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((size_type *)local_c0._0_8_ != psVar3) {
    operator_delete((void *)local_c0._0_8_,local_c0.descr_._M_string_length + 1);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  values_00._8_8_ = 3;
  values_00.values_ = this->socp2qc_values_;
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "cvt:socp2qc socp2qcmode socp2qc",(this->socp2qc_mode_text_)._M_dataplus._M_p,
             &(this->options_).passSOCP2QC_,values_00);
  (this->options_).passSOCP2QC_ = 2;
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"acc:_all",
             "Solver acceptance level for all constraints and expressions. Value meaning: as described in the specific acc:... options.\n\nCan be useful to disable all reformulations (acc:_all=2), or force linearization (acc:_all=0.)"
             ,&(this->options_).accAll_,0,4);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"acc:_expr","HIDDEN",
             &(this->options_).accExpr_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,"alg:relax relax",
             "0*/1: Whether to relax integrality of variables.",&(this->options_).relax_,0,1);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "sol:chk:mode solcheck checkmode chk:mode",
             "Solution checking mode. Sum of a subset of the following bits:\n\n| 1 - Check variable bounds and integrality.\n| 2 - Check original model constraints, as well as       any non-linear expression values       reported by the solver.\n| 4 - Check intermediate auxiliary constraints       (i.e., those which were reformulated further).\n| 8 - Check final auxiliary constraints sent to solver.\n| 16 - Check objective values.\n| 32, 64, 128, 256, 512 - similar, but       non-linear expressions are recomputed       (vs using their values reported by the solver.)       *Experimental.* This is an idealistic check, because       it does not consider possible tolerances       applied by the solver when computing       expression values.\n\nDefault: 1+2+512."
             ,&(this->options_).solcheckmode_,0,0x3ff);
  SolverOptionManager::AddStoredOption<double>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "sol:chk:feastol sol:chk:eps chk:eps chk:feastol",
             "Absolute tolerance to check objective values, variable and constraint bounds. Default 1e-6."
             ,&(this->options_).solfeastol_,0.0,1e+100);
  SolverOptionManager::AddStoredOption<double>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "sol:chk:feastolrel sol:chk:epsrel chk:epsrel chk:feastolrel",
             "Relative tolerance to check objective values, variable and constraint bounds. Default 1e-6."
             ,&(this->options_).solfeastolrel_,0.0,1e+100);
  SolverOptionManager::AddStoredOption<double>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "sol:chk:inttol sol:chk:inteps sol:inteps chk:inttol",
             "Solution checking tolerance for variables\' integrality. Default 1e-5.",
             &(this->options_).solinttol_,0.0,1e+100);
  SolverOptionManager::AddStoredOption<bool>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "sol:chk:infeas chk:infeas checkinfeas",
             "Check even infeasible solution condidates, whenever solver reports them.",
             &(this->options_).solcheckinfeas_,false,true);
  SolverOptionManager::AddStoredOption<bool>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "sol:chk:fail chk:fail checkfail",(this->solchkfailtext_)._M_dataplus._M_p,
             &(this->options_).solcheckfail_,false,true);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "sol:chk:round chk:round chk:rnd",
             "AMPL solution_round option when checking: round to this number of decimals after comma (before comma if negative.)"
             ,&(this->options_).sol_round_,-1000,1000);
  SolverOptionManager::AddStoredOption<int>
            (&((this->super_EnvKeeper).env_)->super_SolverOptionManager,
             "sol:chk:prec chk:prec chk:precision",
             "AMPL solution_precision option when checking: number of significant digits.",
             &(this->options_).sol_prec_,-1000,1000);
  pEVar2 = (this->super_EnvKeeper).env_;
  local_98 = &local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"solved? MP solution check failed (option sol:chk:fail) ","");
  paVar4 = &local_c0.descr_.field_2;
  local_c0.first_ = 0x96;
  local_c0.last_ = 0x96;
  if (local_98 == &local_88) {
    local_c0.descr_.field_2._8_8_ = local_88._8_8_;
    local_c0.descr_._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_c0.descr_._M_dataplus._M_p = (pointer)local_98;
  }
  local_c0.descr_.field_2._M_allocated_capacity._1_7_ = local_88._M_allocated_capacity._1_7_;
  local_c0.descr_.field_2._M_local_buf[0] = local_88._M_local_buf[0];
  local_c0.descr_._M_string_length = local_90;
  local_90 = 0;
  local_88._M_local_buf[0] = '\0';
  __l._M_len = 1;
  __l._M_array = &local_c0;
  local_98 = &local_88;
  std::
  set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
  ::set((set<mp::SolveResultRegistry::RegEntry,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
         *)&local_58,__l,(less<mp::SolveResultRegistry::RegEntry> *)local_78,&local_c1);
  SolveResultRegistry::AddSolveResults
            (&pEVar2->super_SolveResultRegistry,(SRRegMap *)&local_58,false);
  std::
  _Rb_tree<mp::SolveResultRegistry::RegEntry,_mp::SolveResultRegistry::RegEntry,_std::_Identity<mp::SolveResultRegistry::RegEntry>,_std::less<mp::SolveResultRegistry::RegEntry>,_std::allocator<mp::SolveResultRegistry::RegEntry>_>
  ::~_Rb_tree(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.descr_._M_dataplus._M_p != paVar4) {
    operator_delete(local_c0.descr_._M_dataplus._M_p,
                    local_c0.descr_.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

void InitOwnOptions() {
    /// Should be called after adding all constraint keepers
    FlatModel::ConsiderAcceptanceOptions(*this, GetModelAPI(), GetEnv());

    GetEnv().AddStoredOption("tech:writegraph cvt:writegraph writegraph exportgraph",
        "File to export conversion graph. Format: JSON Lines.",
        options_.file_graph_export_);
    GetEnv().AddOption("cvt:pre:all",
        "0/1*: Set to 0 to disable most presolve in the flat converter.",
        options_.preprocessAnything_, 0, 1);
    GetEnv().AddOption("cvt:pre:eqresult",
        "0/1*: Preprocess reified equality comparison's decidable cases.",
        options_.preprocessEqualityResultBounds_, 0, 1);
    GetEnv().AddOption("cvt:pre:eqbinary",
        "0/1*: Preprocess reified equality comparison with a binary variable.",
        options_.preprocessEqualityBvar_, 0, 1);
    GetEnv().AddOption("cvt:pre:ineqresult",
                       "0/1*: Preprocess reified inequality comparison's decidable cases.",
                       options_.preprocessInequalityResultBounds_, 0, 1);
    GetEnv().AddOption("cvt:pre:ineqrhs",
                       "0/1*: Preprocess reified inequality comparison's right-hand sides.",
                       options_.preprocessInequalityRhs_, 0, 1);
    GetEnv().AddOption("cvt:pre:unnest",
        "0/1*: Inline nested expressions, currently Ands/Ors.",
        options_.preproNestedAndOrs_, 0, 1);

    GetEnv().AddOption("cvt:quadobj passquadobj",
                       ModelAPIAcceptsQuadObj() ?
        "0/1*: Pass quadratic objective terms to the solver. "
        "When 0, if the solver accepts quadratic constraints, "
                                                "such a constraint will be created with those, "
                                                "otherwise linearly approximated."
                       :
        "0*/1: Pass quadratic objective terms to the solver. "
                                                  "When 0, if the solver accepts quadratic constraints, "
                                                  "such a constraint will be created with those, "
                                                  "otherwise linearly approximated.",
        options_.passQuadObj_, 0, 1);
    GetEnv().AddOption("cvt:quadcon passquadcon",
                       "Convenience option. "
                       "Set to 0 to disable quadratic constraints. "
                       "Synonym for acc:quad..=0. "
                       "Currently this disables out-multiplication "
                       "of quadratic terms, then they are linearized.",
                       options_.passQuadCon_, 0, 1);
    GetEnv().AddOption("cvt:qp2passes cvt:qp2pass qp2passes qp2pass",
                       "Parse sums of QP expressions in 2 passes. "
                       "Usually faster. Default 1.",
                       options_.useQP2Pass_, 0, 1);
    GetEnv().AddOption("cvt:multoutcard multoutcard",
                       "Up to which (estimated) QP matrix cardinality "
                       "should a product of 2 linear expressions "
                       "be multiplied out. Default 1e9.\n"
                       "\n"
                       "Can speed up model input, but prone to "
                       "numerical issues.",
                       options_.QPMultOutCard_, 0.0, 1e20);


    GetEnv().AddOption("cvt:expcones expcones",
                       ModelAPIAcceptsExponentialCones() ?
                         "0/1*: Recognize exponential cones." :
                         "0*/1: Recognize exponential cones.",
                       options_.passExpCones_, 0, 1);
    options_.passExpCones_ = ModelAPIAcceptsExponentialCones();
    // Should be after construction
    socp_mode_text_ =
      "Second-Order Cone recognition mode:\n"
      "\n.. value-table::\n"
      "Recognized SOCP forms can be further converted to "
      "(SOCP-standardized) quadratic constraints, see cvt:socp2qc. "
      "Default: " + std::to_string(DefaultSOCPMode()) + ".";
    GetEnv().AddStoredOption("cvt:socp socpmode socp",
                       socp_mode_text_.c_str(),
                       options_.passSOCPCones_, socp_values_);
    options_.passSOCPCones_ = DefaultSOCPMode();
    socp2qc_mode_text_ =
      "Mode to convert recognized SOCP forms to "
      "SOCP-standardized quadratic constraints:\n"
      "\n.. value-table::\n"
      "Such conversion can be necessary "
      "if the solver does not accept "
      "a mix of conic and quadratic constraints/objectives. "
      "Default: " + std::to_string(DefaultSOCP2QCMode()) + ".";
    GetEnv().AddStoredOption("cvt:socp2qc socp2qcmode socp2qc",
                       socp2qc_mode_text_.c_str(),
                       options_.passSOCP2QC_, socp2qc_values_);
    options_.passSOCP2QC_ = DefaultSOCP2QCMode();

    GetEnv().AddStoredOption("acc:_all",
                             "Solver acceptance level for all "
                             "constraints and expressions. "
                             "Value meaning: as described in the specific "
                             "acc:... options.\n"
                             "\n"
                             "Can be useful to disable all reformulations (acc:_all=2), "
                             "or force linearization (acc:_all=0.)",
                             options_.accAll_, 0, 4);

    if constexpr (IfAcceptingNLOutput())
      GetEnv().AddStoredOption("acc:_expr",
                        fmt::format(
                            "Solver acceptance level for all expressions, "
                            "default {}:\n\n.. value-table::",
                                   options_.accExpr_).c_str(),
                        options_.accExpr_, values_allexpr_acceptance_);
    else
      GetEnv().AddStoredOption("acc:_expr", "HIDDEN", options_.accExpr_, 0, 1);

    GetEnv().AddOption("alg:relax relax",
        "0*/1: Whether to relax integrality of variables.",
        options_.relax_, 0, 1);

    GetEnv().AddStoredOption(
          "sol:chk:mode solcheck checkmode chk:mode",
        "Solution checking mode. "
        "Sum of a subset of the following bits:\n"
        "\n"
        "| 1 - Check variable bounds and integrality.\n"
        "| 2 - Check original model constraints, as well as "
        "      any non-linear expression values "
        "      reported by the solver.\n"
        "| 4 - Check intermediate auxiliary constraints "
        "      (i.e., those which were reformulated further).\n"
        "| 8 - Check final auxiliary constraints sent to solver.\n"
        "| 16 - Check objective values.\n"
        "| 32, 64, 128, 256, 512 - similar, but "
        "      non-linear expressions are recomputed "
        "      (vs using their values reported by the solver.) "
        "      *Experimental.* This is an idealistic check, because "
        "      it does not consider possible tolerances "
        "      applied by the solver when computing "
        "      expression values.\n"
                             "\n"
                             "Default: 1+2+512.",
        options_.solcheckmode_, 0, 1023);
    GetEnv().AddOption("sol:chk:feastol sol:chk:eps chk:eps chk:feastol",
        "Absolute tolerance to check objective values, variable "
        "and constraint bounds. Default 1e-6.",
        options_.solfeastol_, 0.0, 1e100);
    GetEnv().AddOption("sol:chk:feastolrel sol:chk:epsrel chk:epsrel chk:feastolrel",
        "Relative tolerance to check objective values, variable "
        "and constraint bounds. Default 1e-6.",
        options_.solfeastolrel_, 0.0, 1e100);
    GetEnv().AddOption("sol:chk:inttol sol:chk:inteps sol:inteps chk:inttol",
        "Solution checking tolerance for variables' integrality. "
        "Default 1e-5.",
        options_.solinttol_, 0.0, 1e100);
    GetEnv().AddOption("sol:chk:infeas chk:infeas checkinfeas",
                       "Check even infeasible solution condidates, "
                       "whenever solver reports them.",
                       options_.solcheckinfeas_, false, true);
    GetEnv().AddOption("sol:chk:fail chk:fail checkfail",
                       solchkfailtext_.c_str(),
                       options_.solcheckfail_, false, true);
    GetEnv().AddOption("sol:chk:round chk:round chk:rnd",
        "AMPL solution_round option when checking: "
                       "round to this number of decimals after comma "
                       "(before comma if negative.)",
                       options_.sol_round_, -1000, 1000);
    GetEnv().AddOption("sol:chk:prec chk:prec chk:precision",
        "AMPL solution_precision option when checking: "
                       "number of significant digits.",
                       options_.sol_prec_, -1000, 1000);

    ////////////////////// Solve result codes ////////////////////////
    GetEnv().AddSolveResults({
                               {sol::MP_SOLUTION_CHECK,
                                "solved? MP solution check failed "
                                "(option sol:chk:fail) "}
                             });
  }